

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::computePrimInfo
          (PrimInfo *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set,
          LinearSpace3fa *space)

{
  ulong uVar1;
  Geometry *pGVar2;
  undefined1 auVar3 [16];
  unsigned_long uVar4;
  undefined1 auVar5 [16];
  char cVar6;
  runtime_error *this_00;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  anon_class_16_2_f88231f3 computeBounds;
  CentGeomBBox3fa bounds;
  task_group_context context;
  undefined4 uStack_1b0;
  undefined1 local_1b8 [16];
  undefined4 uStack_1ac;
  UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *local_198;
  LinearSpace3fa *local_190;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  undefined1 local_178 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined1 local_108 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  code *local_d8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8 [2];
  undefined8 local_88;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  uVar7 = set->_begin;
  uVar1 = set->_end;
  local_158 = _DAT_01f7a9f0;
  uStack_1b0 = DAT_01f7aa00._8_4_;
  uStack_1ac = DAT_01f7aa00._12_4_;
  local_148 = _DAT_01f7aa00;
  local_138 = _DAT_01f7a9f0;
  local_128 = _DAT_01f7aa00;
  uVar8 = uVar1 - uVar7;
  local_198 = this;
  local_190 = space;
  if (uVar8 < 0x1000) {
    local_1b8._0_4_ = (int)DAT_01f7aa00;
    local_1b8._4_4_ = DAT_01f7aa00._4_4_;
    local_168 = _DAT_01f7a9f0;
    local_178 = _DAT_01f7aa00;
    local_188 = _DAT_01f7a9f0;
    if (uVar7 < uVar1) {
      uVar7 = uVar7 << 5 | 0x1c;
      do {
        pGVar2 = (this->scene->geometries).items[*(uint *)((long)this->prims + (uVar7 - 0x10))].ptr;
        (*(pGVar2->super_RefCount)._vptr_RefCount[0x3a])
                  (&local_c8,pGVar2,space,
                   (ulong)*(uint *)((long)&(this->prims->lower).field_0 + uVar7));
        auVar5._12_2_ = local_c8._12_2_;
        auVar5._0_4_ = local_c8.m128[0];
        auVar5._4_4_ = local_c8.m128[1];
        auVar5._8_4_ = local_c8.m128[2];
        auVar5._14_2_ = local_c8._14_2_;
        local_188.m128 = (__m128)minps(local_188.m128,auVar5);
        local_178 = maxps(local_178,(undefined1  [16])local_b8);
        fVar9 = local_c8.field_1.x + local_b8.m128[0];
        fVar10 = local_c8.field_1.y + local_b8.m128[1];
        fVar11 = local_c8.field_1.z + local_b8.m128[2];
        fVar12 = auVar5._12_4_ + local_b8.m128[3];
        auVar13._4_4_ = fVar10;
        auVar13._0_4_ = fVar9;
        auVar13._8_4_ = fVar11;
        auVar13._12_4_ = fVar12;
        local_168.m128 = (__m128)minps(local_168.m128,auVar13);
        auVar3._4_4_ = fVar10;
        auVar3._0_4_ = fVar9;
        auVar3._8_4_ = fVar11;
        auVar3._12_4_ = fVar12;
        auVar13 = maxps(local_1b8,auVar3);
        local_1b8._0_4_ = auVar13._0_4_;
        local_1b8._4_4_ = auVar13._4_4_;
        uStack_1b0 = auVar13._8_4_;
        uStack_1ac = auVar13._12_4_;
        uVar7 = uVar7 + 0x20;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  else {
    local_c8._12_2_ = 0x401;
    local_a8[0]._0_8_ = 0;
    local_a8[0]._8_8_ = 0;
    local_88 = 8;
    tbb::detail::r1::initialize((task_group_context *)&local_c8.field_1);
    local_38 = 0x400;
    local_d8[0] = CentGeom<embree::BBox<embree::Vec3fa>_>::merge2;
    local_d8[1] = (code *)&local_198;
    local_48 = uVar1;
    local_40 = uVar7;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::CentGeom<embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::CentGeom<embree::BBox<embree::Vec3fa>>,embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,32ul>::computePrimInfo(embree::range<unsigned_long>const&,embree::LinearSpace3<embree::Vec3fa>const&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,32ul>::computePrimInfo(embree::range<unsigned_long>const&,embree::LinearSpace3<embree::Vec3fa>const&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(const&)(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)_1_,embree::CentGeom<embree::BBox<embree::Vec3fa>>const(embree::CentGeom<embree::BBox<embree::Vec3fa>>const&,embree::CentGeom<embree::BBox<embree::Vec3fa>>const&)>
              ((CentGeom<embree::BBox<embree::Vec3fa>_> *)&local_118.field_1,(d1 *)&local_48,
               (blocked_range<unsigned_long> *)&local_158.field_1,
               (CentGeom<embree::BBox<embree::Vec3fa>_> *)local_d8,
               (anon_class_16_2_ed117de8_conflict15 *)
               CentGeom<embree::BBox<embree::Vec3fa>_>::merge2,
               (_func_CentGeom<embree::BBox<embree::Vec3fa>_>_CentGeom<embree::BBox<embree::Vec3fa>_>_ptr_CentGeom<embree::BBox<embree::Vec3fa>_>_ptr
                *)&local_c8,local_1b8._0_8_);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_c8.field_1);
    if (cVar6 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_c8.field_1);
    local_1b8._0_4_ = local_e8;
    local_1b8._4_4_ = uStack_e4;
    uStack_1b0 = uStack_e0;
    uStack_1ac = uStack_dc;
    local_168 = local_f8;
    local_178 = local_108;
    local_188 = local_118;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       local_188;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_178;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       local_168;
  *(undefined4 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_1b8._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 4) = local_1b8._4_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = uStack_1b0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 0xc) = uStack_1ac;
  uVar4 = set->_end;
  __return_storage_ptr__->begin = set->_begin;
  __return_storage_ptr__->end = uVar4;
  return __return_storage_ptr__;
}

Assistant:

const PrimInfo computePrimInfo(const range<size_t>& set, const LinearSpace3fa& space)
        {
          auto computeBounds = [&](const range<size_t>& r) -> CentGeomBBox3fa
            {
              CentGeomBBox3fa bounds(empty);
              for (size_t i=r.begin(); i<r.end(); i++) {
                Geometry* mesh = scene->get(prims[i].geomID());
                bounds.extend(mesh->vbounds(space,prims[i].primID()));
              }
              return bounds;
            };
          
          const CentGeomBBox3fa bounds = parallel_reduce(set.begin(), set.end(), size_t(1024), size_t(4096), 
                                                         CentGeomBBox3fa(empty), computeBounds, CentGeomBBox3fa::merge2);

          return PrimInfo(set.begin(),set.end(),bounds);
        }